

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O0

void __thiscall
HashUtil_Sha256DBytes_Test::~HashUtil_Sha256DBytes_Test(HashUtil_Sha256DBytes_Test *this)

{
  HashUtil_Sha256DBytes_Test *this_local;
  
  ~HashUtil_Sha256DBytes_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashUtil, Sha256DBytes) {
  std::vector<uint8_t> target;
  target.push_back(0x01);
  target.push_back(0x02);
  target.push_back(0x03);
  ByteData256 byte_data = HashUtil::Sha256D(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "19c6197e2140b9d034fb20b9ac7bb753a41233caf1e1dafda7316a99cef41416");
}